

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * BuildScript<CScript,opcodetype,opcodetype,CScript&,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,opcodetype *inputs_1,
                    opcodetype *inputs_2,CScript *inputs_3,opcodetype *inputs_4)

{
  long in_FS_OFFSET;
  int cnt;
  anon_class_16_2_441f04d1 local_90;
  anon_class_16_2_441f04d1 local_80;
  anon_class_16_2_441f04d1 local_70;
  anon_class_16_2_441f04d1 local_60;
  anon_class_16_2_441f04d1 local_50;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  local_3c = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  local_50.ret = __return_storage_ptr__;
  local_50.cnt = &local_3c;
  BuildScript<CScript,_opcodetype,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::
  operator()(&local_50,inputs);
  local_60.ret = __return_storage_ptr__;
  local_60.cnt = &local_3c;
  BuildScript<CScript,_opcodetype,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::
  operator()(&local_60,inputs_1);
  local_70.ret = __return_storage_ptr__;
  local_70.cnt = &local_3c;
  BuildScript<CScript,_opcodetype,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::
  operator()(&local_70,inputs_2);
  local_80.ret = __return_storage_ptr__;
  local_80.cnt = &local_3c;
  BuildScript<CScript,_opcodetype,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::
  operator()(&local_80,inputs_3);
  local_90.ret = __return_storage_ptr__;
  local_90.cnt = &local_3c;
  BuildScript<CScript,_opcodetype,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::
  operator()(&local_90,inputs_4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}